

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

bool __thiscall
ProjectBuilderMakefileGenerator::replaceLibrarySuffix
          (ProjectBuilderMakefileGenerator *this,QString *lib_file,ProString *opt,QString *name,
          QString *library)

{
  char16_t *pcVar1;
  QString *pQVar2;
  QMakeProject *pQVar3;
  QString file;
  Data *pDVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  const_iterator cVar8;
  ProStringList *pPVar9;
  QList<ProString> *this_00;
  iterator other;
  SourceFiles *pSVar10;
  QString *pQVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QStringView config;
  undefined8 in_stack_fffffffffffffec8;
  QArrayData *in_stack_fffffffffffffed8;
  QArrayData *pQVar13;
  QArrayData *pQVar14;
  char16_t *pcStack_120;
  QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString> local_f8;
  QString local_b8;
  QArrayData *local_a0;
  Data *local_98;
  char16_t *local_90;
  QArrayData *local_88;
  undefined1 *puStack_80;
  QHash<QString,_bool> local_78;
  QMap<ProKey,_ProStringList> local_70;
  ProString local_68;
  QHash<QString,_QList<QString>_> local_38;
  
  local_38.d = *(Data **)(in_FS_OFFSET + 0x28);
  if ((lib_file->d).size == 0) {
    bVar5 = false;
    goto LAB_00142927;
  }
  local_70.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )0x0;
  bVar5 = QMakeMetaInfo::readLib((QMakeMetaInfo *)&local_70,lib_file);
  if (bVar5) {
    ProKey::ProKey((ProKey *)&local_f8,"QMAKE_PRL_TARGET");
    bVar5 = true;
    if ((local_70.d.d.ptr !=
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )0x0) &&
       (cVar8 = std::
                _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                        *)((long)local_70.d.d.ptr + 8),(key_type *)&local_f8),
       cVar8._M_node != (_Base_ptr)((long)local_70.d.d.ptr + 0x10))) {
      pPVar9 = QMap<ProKey,_ProStringList>::operator[](&local_70,(ProKey *)&local_f8);
      bVar5 = (pPVar9->super_QList<ProString>).d.size == 0;
    }
    if ((QArrayData *)local_f8.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.a.a,2,0x10);
      }
    }
    if (bVar5) goto LAB_0014218f;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &((lib_file->d).d)->super_QArrayData;
    local_98 = (Data *)(lib_file->d).ptr;
    local_90 = (char16_t *)(lib_file->d).size;
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_a0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_a0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file.d.ptr = (char16_t *)name;
    file.d.d = (Data *)in_stack_fffffffffffffec8;
    file.d.size = (qsizetype)in_stack_fffffffffffffed8;
    MakefileGenerator::fileInfo((MakefileGenerator *)&local_f8,file);
    QFileInfo::absolutePath();
    QFileInfo::~QFileInfo((QFileInfo *)&local_f8);
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)&stack0xfffffffffffffed8,"QMAKE_PRL_TARGET");
    if (((local_70.d.d.ptr ==
          (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
           )0x0) ||
        (cVar8 = std::
                 _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                 ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                         *)((long)local_70.d.d.ptr + 8),(key_type *)&stack0xfffffffffffffed8),
        cVar8._M_node == (_Base_ptr)((long)local_70.d.d.ptr + 0x10))) ||
       (pPVar9 = QMap<ProKey,_ProStringList>::operator[]
                           (&local_70,(ProKey *)&stack0xfffffffffffffed8),
       (pPVar9->super_QList<ProString>).d.size == 0)) {
      ProString::ProString(&local_68,"");
    }
    else {
      this_00 = &QMap<ProKey,_ProStringList>::operator[]
                           (&local_70,(ProKey *)&stack0xfffffffffffffed8)->super_QList<ProString>;
      other = QList<ProString>::begin(this_00);
      ProString::ProString(&local_68,other.i);
    }
    local_f8.a.a = (QString *)&local_88;
    local_f8.a.b = &Option::dir_sep;
    ProString::ProString(&local_f8.b,&local_68);
    QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString>::convertTo<QString>
              (&local_b8,&local_f8);
    pQVar13 = &((library->d).d)->super_QArrayData;
    pcVar1 = (library->d).ptr;
    (library->d).d = local_b8.d.d;
    (library->d).ptr = local_b8.d.ptr;
    pQVar2 = (QString *)(library->d).size;
    (library->d).size = local_b8.d.size;
    local_b8.d.d = (Data *)pQVar13;
    local_b8.d.ptr = pcVar1;
    local_b8.d.size = (qsizetype)pQVar2;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
    if (&(local_f8.b.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.b.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.b.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_f8.b.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_f8.b.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (in_stack_fffffffffffffed8 != (QArrayData *)0x0) {
      LOCK();
      (in_stack_fffffffffffffed8->ref_)._q_value.super___atomic_base<int>._M_i =
           (in_stack_fffffffffffffed8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((in_stack_fffffffffffffed8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(in_stack_fffffffffffffed8,2,0x10);
      }
    }
    if (Option::debug_level != 0) {
      ProString::toLatin1((QByteArray *)&local_f8,opt);
      pSVar10 = (SourceFiles *)local_f8.a.b;
      if ((SourceFiles *)local_f8.a.b == (SourceFiles *)0x0) {
        pSVar10 = (SourceFiles *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_68);
      pQVar11 = (QString *)local_68.m_string.d.ptr;
      if ((QString *)local_68.m_string.d.ptr == (QString *)0x0) {
        pQVar11 = (QString *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&stack0xfffffffffffffed8);
      if (pcStack_120 == (char16_t *)0x0) {
        pcStack_120 = (char16_t *)&QByteArray::_empty;
      }
      debug_msg_internal(1,"pbuilder: Found library (%s) via PRL %s (%s)",pSVar10,pQVar11,
                         pcStack_120);
      if (in_stack_fffffffffffffed8 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffed8->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffed8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((in_stack_fffffffffffffed8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(in_stack_fffffffffffffed8,1,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,1,0x10);
        }
      }
      if ((QArrayData *)local_f8.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_f8.a.a,1,0x10);
        }
      }
    }
    pQVar3 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    QVar12.m_data = (storage_type *)0x1c;
    QVar12.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar12);
    pQVar11 = local_f8.a.a;
    config.m_data = (storage_type_conflict *)local_f8.a.b;
    config.m_size = (qsizetype)local_f8.b.m_string.d.d;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar3->super_QMakeEvaluator,config,false);
    if ((QArrayData *)pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&pQVar11->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&pQVar11->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&pQVar11->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pQVar11,2,0x10);
      }
    }
    if (bVar5) {
      pQVar13 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_XCODE_LIBRARY_SUFFIX_SETTING");
      QMakeEvaluator::first
                ((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_68);
      ProString::toQString((QString *)&stack0xfffffffffffffed8,(ProString *)&local_f8);
      if ((QArrayData *)local_f8.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_f8.a.a,2,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)&local_68,"QMAKE_XCODE_LIBRARY_SUFFIX");
      QMakeEvaluator::first
                ((ProString *)&local_f8,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_68);
      ProString::toQString(&local_b8,(ProString *)&local_f8);
      if ((QArrayData *)local_f8.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_f8.a.a,2,0x10);
        }
      }
      if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_68.m_string.d.d = (Data *)0x2aa70a;
      local_68.m_string.d.size = 0x2aebcb;
      local_68.m_string.d.ptr = (char16_t *)&stack0xfffffffffffffed8;
      QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>::
      convertTo<QString>((QString *)&local_f8,
                         (QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>
                          *)&local_68);
      pSVar10 = (SourceFiles *)local_f8.a.b;
      local_f8.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.b.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar14 = (QArrayData *)local_f8.a.a;
      if (pQVar13 != (QArrayData *)0x0) {
        LOCK();
        (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_f8.a.a = (QString *)pQVar13;
          QArrayData::deallocate(pQVar13,2,0x10);
          pQVar13 = (QArrayData *)local_f8.a.a;
        }
      }
      local_f8.a.a = (QString *)pQVar13;
      if ((QString *)local_b8.d.size == (QString *)0x0) {
        iVar7 = QString::lastIndexOf
                          ((QString *)library,(longlong)name,(CaseSensitivity)(library->d).size);
        if (iVar7 != -1) {
          if (pSVar10 == (SourceFiles *)0x0) {
            pSVar10 = (SourceFiles *)&QString::_empty;
          }
          QString::insert((longlong)library,(QChar *)((long)iVar7 + (name->d).size),
                          (longlong)pSVar10);
        }
      }
      else {
        local_68.m_string.d.ptr = (char16_t *)CONCAT71(local_68.m_string.d.ptr._1_7_,0x2e);
        local_68.m_string.d.d = (Data *)&local_b8;
        QStringBuilder<QString_&,_char>::convertTo<QString>
                  ((QString *)&local_f8,(QStringBuilder<QString_&,_char> *)&local_68);
        iVar7 = QString::lastIndexOf
                          ((QString *)library,(longlong)&local_f8,(CaseSensitivity)(library->d).size
                          );
        if ((QArrayData *)local_f8.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0
             ) {
            QArrayData::deallocate((QArrayData *)local_f8.a.a,2,0x10);
          }
        }
        if (iVar7 == -1) {
          QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_b8.d.ptr);
          pSVar10 = (SourceFiles *)local_f8.a.b;
          if ((SourceFiles *)local_f8.a.b == (SourceFiles *)0x0) {
            pSVar10 = (SourceFiles *)&QByteArray::_empty;
          }
          QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(library->d).ptr);
          pQVar11 = (QString *)local_68.m_string.d.ptr;
          if ((QString *)local_68.m_string.d.ptr == (QString *)0x0) {
            pQVar11 = (QString *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Failed to find expected suffix \'%s\' for library \'%s\'.",pSVar10,
                   pQVar11);
          pDVar4 = local_68.m_string.d.d;
          if (&(local_68.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(local_68.m_string.d.d)->super_QArrayData)->d =
                 *(int *)&((DataPointer *)&(local_68.m_string.d.d)->super_QArrayData)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&pDVar4->super_QArrayData)->d == 0) {
              QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,1,0x10);
            }
          }
          if ((QArrayData *)local_f8.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_f8.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_f8.a.a,1,0x10);
            }
          }
        }
        else {
          QString::replace((longlong)library,(long)iVar7,(QString *)local_b8.d.size);
          cVar6 = QString::endsWith((QString *)name,(CaseSensitivity)&local_b8);
          if (cVar6 != '\0') {
            QString::chop((longlong)name);
          }
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar14,2,0x10);
        }
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    bVar5 = true;
  }
  else {
LAB_0014218f:
    bVar5 = false;
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_70.d);
LAB_00142927:
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_38.d) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool ProjectBuilderMakefileGenerator::replaceLibrarySuffix(const QString &lib_file,
                                                           const ProString &opt,
                                                           QString &name, QString &library)
{
    /* This isn't real nice, but it is real useful. This looks in a prl
       for what the library will ultimately be called so we can stick it
       in the ProjectFile. If the prl format ever changes (not likely) then
       this will not really work. However, more concerning is that it will
       encode the version number in the Project file which might be a bad
       things in days to come? --Sam
    */
    if (lib_file.isEmpty())
        return false;

    QMakeMetaInfo libinfo;
    if (!libinfo.readLib(lib_file) || libinfo.isEmpty("QMAKE_PRL_TARGET"))
        return false;

    const QString libDir = fileInfo(lib_file).absolutePath();
    library = libDir + Option::dir_sep + libinfo.first("QMAKE_PRL_TARGET");

    debug_msg(1, "pbuilder: Found library (%s) via PRL %s (%s)",
              opt.toLatin1().constData(), lib_file.toLatin1().constData(), library.toLatin1().constData());

    if (project->isActiveConfig("xcode_dynamic_library_suffix")) {
        QString suffixSetting = project->first("QMAKE_XCODE_LIBRARY_SUFFIX_SETTING").toQString();
        if (!suffixSetting.isEmpty()) {
            QString librarySuffix = project->first("QMAKE_XCODE_LIBRARY_SUFFIX").toQString();
            suffixSetting = "$(" + suffixSetting + ")";
            if (!librarySuffix.isEmpty()) {
                int pos = library.lastIndexOf(librarySuffix + '.');
                if (pos == -1) {
                    warn_msg(WarnLogic, "Failed to find expected suffix '%s' for library '%s'.",
                             qPrintable(librarySuffix), qPrintable(library));
                } else {
                    library.replace(pos, librarySuffix.size(), suffixSetting);
                    if (name.endsWith(librarySuffix))
                        name.chop(librarySuffix.size());
                }
            } else {
                int pos = library.lastIndexOf(name);
                if (pos != -1)
                    library.insert(pos + name.size(), suffixSetting);
            }
        }
    }

    return true;
}